

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpageranges.cpp
# Opt level: O1

QPageRanges __thiscall QPageRanges::fromString(QPageRanges *this,QString *ranges)

{
  qsizetype qVar1;
  long lVar2;
  long lVar3;
  QPageRangesPrivate *ptr;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  bool ok_1;
  bool ok;
  Range local_a4;
  bool local_99;
  QArrayDataPointer<QString> local_98;
  QArrayDataPointer<QString> local_78;
  QArrayDataPointer<QPageRanges::Range> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (Range *)0x0;
  local_58.size = 0;
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d._0_4_ = 0xaaaaaaaa;
  local_78.d._4_4_ = 0xaaaaaaaa;
  local_78.ptr._0_4_ = 0xaaaaaaaa;
  local_78.ptr._4_4_ = 0xaaaaaaaa;
  QString::split(&local_78,ranges,0x2c,0,1);
  if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
    lVar5 = CONCAT44(local_78.ptr._4_4_,local_78.ptr._0_4_);
    lVar4 = local_78.size * 0x18;
    do {
      if (*(Data **)(lVar5 + 0x10) == (Data *)0x0) {
LAB_003b1bb7:
        QPageRanges(this);
        goto LAB_003b1bbf;
      }
      local_98.ptr = *(QString **)(lVar5 + 8);
      local_98.d = *(Data **)(lVar5 + 0x10);
      qVar1 = QStringView::indexOf((QStringView *)&local_98,(QChar)0x2d,0,CaseSensitive);
      if (qVar1 != -1) {
        local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        QString::split(&local_98,lVar5,0x2d,0,1);
        if ((undefined1 *)local_98.size == (undefined1 *)0x2) {
          local_99 = true;
          QVar6.m_data = ((local_98.ptr)->d).ptr;
          QVar6.m_size = ((local_98.ptr)->d).size;
          lVar2 = QString::toIntegral_helper(QVar6,&local_99,10);
          if ((int)lVar2 != lVar2) {
            local_99 = false;
            lVar2 = 0;
          }
          if (local_99 == true) {
            QVar7.m_data = local_98.ptr[1].d.ptr;
            QVar7.m_size = local_98.ptr[1].d.size;
            lVar3 = QString::toIntegral_helper(QVar7,&local_99,10);
            if ((int)lVar3 != lVar3) {
              local_99 = false;
              lVar3 = 0;
            }
            if ((((local_99 == true) && (lVar2 <= lVar3)) && (0 < lVar2)) && (0 < lVar3)) {
              local_a4.from = (int)lVar2;
              local_a4.to = (int)lVar3;
              QtPrivate::QMovableArrayOps<QPageRanges::Range>::emplace<QPageRanges::Range>
                        ((QMovableArrayOps<QPageRanges::Range> *)&local_58,local_58.size,&local_a4);
              QList<QPageRanges::Range>::end((QList<QPageRanges::Range> *)&local_58);
              QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
              goto LAB_003b1b3b;
            }
          }
        }
        QPageRanges(this);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
        goto LAB_003b1bbf;
      }
      local_a4.from = CONCAT31(local_a4.from._1_3_,0xaa);
      QVar8.m_data = *(storage_type_conflict **)(lVar5 + 8);
      QVar8.m_size = *(qsizetype *)(lVar5 + 0x10);
      lVar2 = QString::toIntegral_helper(QVar8,(bool *)&local_a4,10);
      if ((int)lVar2 != lVar2) {
        local_a4.from = local_a4.from & 0xffffff00;
        lVar2 = 0;
      }
      if ((lVar2 < 1) || ((char)local_a4.from == '\0')) goto LAB_003b1bb7;
      local_98.d = (Data *)CONCAT44((int)lVar2,(int)lVar2);
      QtPrivate::QMovableArrayOps<QPageRanges::Range>::emplace<QPageRanges::Range>
                ((QMovableArrayOps<QPageRanges::Range> *)&local_58,local_58.size,(Range *)&local_98)
      ;
      QList<QPageRanges::Range>::end((QList<QPageRanges::Range> *)&local_58);
LAB_003b1b3b:
      lVar5 = lVar5 + 0x18;
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != 0);
  }
  (this->d).d.ptr = (QPageRangesPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QPageRanges(this);
  ptr = (QPageRangesPrivate *)operator_new(0x20);
  (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  (ptr->intervals).d.d = (Data *)0x0;
  (ptr->intervals).d.ptr = (Range *)0x0;
  (ptr->intervals).d.size = 0;
  QExplicitlySharedDataPointer<QPageRangesPrivate>::reset(&this->d,ptr);
  QArrayDataPointer<QPageRanges::Range>::operator=(&(((this->d).d.ptr)->intervals).d,&local_58);
  QPageRangesPrivate::mergeIntervals((this->d).d.ptr);
LAB_003b1bbf:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointer<QPageRangesPrivate>)
           (QExplicitlySharedDataPointer<QPageRangesPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QPageRanges QPageRanges::fromString(const QString &ranges)
{
    QList<Range> intervals;
    const QStringList items = ranges.split(u',');
    for (const QString &item : items) {
        if (item.isEmpty())
            return QPageRanges();

        if (item.contains(u'-')) {
            const QStringList rangeItems = item.split(u'-');
            if (rangeItems.size() != 2)
                return QPageRanges();

            bool ok;
            const int number1 = rangeItems[0].toInt(&ok);
            if (!ok)
                return QPageRanges();

            const int number2 = rangeItems[1].toInt(&ok);
            if (!ok)
                return QPageRanges();

            if (number1 < 1 || number2 < 1 || number2 < number1)
                return QPageRanges();

            intervals.append({number1, number2});

        } else {
            bool ok;
            const int number = item.toInt(&ok);
            if (!ok)
                return QPageRanges();

            if (number < 1)
                return QPageRanges();

            intervals.append({number, number});
        }
    }

    QPageRanges newRanges;
    newRanges.d.reset(new QPageRangesPrivate);
    newRanges.d->intervals = intervals;
    newRanges.d->mergeIntervals();
    return newRanges;
}